

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apriltag_quad_thresh.c
# Opt level: O1

void fit_line(line_fit_pt *lfps,int sz,int i0,int i1,double *lineparm,double *err,double *mse)

{
  int iVar1;
  float fVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  float fVar12;
  
  if (i1 == i0) {
    __assert_fail("i0 != i1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/apriltag_quad_thresh.c"
                  ,0x7f,
                  "void fit_line(struct line_fit_pt *, int, int, int, double *, double *, double *)"
                 );
  }
  if (((sz <= i1) || (sz - i0 == 0 || sz < i0)) || ((i1 | i0) < 0)) {
    __assert_fail("i0 >= 0 && i1 >= 0 && i0 < sz && i1 < sz",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/apriltag_quad_thresh.c"
                  ,0x80,
                  "void fit_line(struct line_fit_pt *, int, int, int, double *, double *, double *)"
                 );
  }
  iVar1 = i1 - i0;
  if (iVar1 == 0 || i1 < i0) {
    if (i0 < 1) {
      __assert_fail("i0 > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/apriltag_quad_thresh.c"
                    ,0x9a,
                    "void fit_line(struct line_fit_pt *, int, int, int, double *, double *, double *)"
                   );
    }
    dVar9 = (lfps[(long)sz + -1].Mx - lfps[(ulong)(uint)i0 - 1].Mx) + lfps[(uint)i1].Mx;
    dVar10 = (lfps[(long)sz + -1].My - lfps[(ulong)(uint)i0 - 1].My) + lfps[(uint)i1].My;
    dVar5 = (lfps[(long)sz + -1].Mxx - lfps[(ulong)(uint)i0 - 1].Mxx) + lfps[(uint)i1].Mxx;
    dVar4 = (lfps[(long)sz + -1].Mxy - lfps[(ulong)(uint)i0 - 1].Mxy) + lfps[(uint)i1].Mxy;
    dVar7 = (lfps[(long)sz + -1].Myy - lfps[(ulong)(uint)i0 - 1].Myy) + lfps[(uint)i1].Myy;
    dVar3 = (lfps[(long)sz + -1].W - lfps[(ulong)(uint)i0 - 1].W) + lfps[(uint)i1].W;
    iVar1 = (sz - i0) + i1;
  }
  else {
    dVar9 = lfps[(uint)i1].Mx;
    dVar10 = lfps[(uint)i1].My;
    dVar5 = lfps[(uint)i1].Mxx;
    dVar4 = lfps[(uint)i1].Mxy;
    dVar7 = lfps[(uint)i1].Myy;
    dVar3 = lfps[(uint)i1].W;
    if (0 < i0) {
      dVar9 = dVar9 - lfps[(ulong)(uint)i0 - 1].Mx;
      dVar10 = dVar10 - lfps[(ulong)(uint)i0 - 1].My;
      dVar5 = dVar5 - lfps[(ulong)(uint)i0 - 1].Mxx;
      dVar4 = dVar4 - lfps[(ulong)(uint)i0 - 1].Mxy;
      dVar7 = dVar7 - lfps[(ulong)(uint)i0 - 1].Myy;
      dVar3 = dVar3 - lfps[(ulong)(uint)i0 - 1].W;
    }
  }
  if (iVar1 < 1) {
    __assert_fail("N >= 2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/apriltag_quad_thresh.c"
                  ,0xad,
                  "void fit_line(struct line_fit_pt *, int, int, int, double *, double *, double *)"
                 );
  }
  dVar9 = dVar9 / dVar3;
  dVar10 = dVar10 / dVar3;
  dVar6 = dVar5 / dVar3 - dVar9 * dVar9;
  dVar5 = dVar4 / dVar3 - dVar9 * dVar10;
  dVar4 = dVar7 / dVar3 - dVar10 * dVar10;
  fVar12 = (float)((dVar6 - dVar4) * (dVar6 - dVar4) + dVar5 * 4.0 * dVar5);
  if (fVar12 < 0.0) {
    fVar2 = sqrtf(fVar12);
  }
  else {
    fVar2 = SQRT(fVar12);
  }
  if (lineparm != (double *)0x0) {
    *lineparm = dVar9;
    lineparm[1] = dVar10;
    if (fVar12 < 0.0) {
      fVar12 = sqrtf(fVar12);
    }
    else {
      fVar12 = SQRT(fVar12);
    }
    dVar11 = (dVar4 + dVar6 + (double)fVar12) * 0.5;
    dVar8 = dVar6 - dVar11;
    dVar7 = dVar8 * dVar8 + dVar5 * dVar5;
    dVar11 = dVar4 - dVar11;
    dVar3 = dVar11 * dVar11 + dVar5 * dVar5;
    dVar10 = dVar7;
    dVar9 = dVar5;
    if (dVar7 <= dVar3) {
      dVar10 = dVar3;
      dVar9 = dVar11;
    }
    fVar12 = (float)dVar10;
    if (fVar12 < 0.0) {
      fVar12 = sqrtf(fVar12);
    }
    else {
      fVar12 = SQRT(fVar12);
    }
    lineparm[2] = (double)(~-(ulong)(dVar3 < dVar7) & (ulong)dVar5 |
                          (ulong)dVar8 & -(ulong)(dVar3 < dVar7)) / (double)fVar12;
    lineparm[3] = dVar9 / (double)fVar12;
  }
  dVar9 = ((dVar4 + dVar6) - (double)fVar2) * 0.5;
  if (err != (double *)0x0) {
    *err = (double)(iVar1 + 1) * dVar9;
  }
  if (mse != (double *)0x0) {
    *mse = dVar9;
  }
  return;
}

Assistant:

void fit_line(struct line_fit_pt *lfps, int sz, int i0, int i1, double *lineparm, double *err, double *mse)
{
    assert(i0 != i1);
    assert(i0 >= 0 && i1 >= 0 && i0 < sz && i1 < sz);

    double Mx, My, Mxx, Myy, Mxy, W;
    int N; // how many points are included in the set?

    if (i0 < i1) {
        N = i1 - i0 + 1;

        Mx  = lfps[i1].Mx;
        My  = lfps[i1].My;
        Mxx = lfps[i1].Mxx;
        Mxy = lfps[i1].Mxy;
        Myy = lfps[i1].Myy;
        W   = lfps[i1].W;

        if (i0 > 0) {
            Mx  -= lfps[i0-1].Mx;
            My  -= lfps[i0-1].My;
            Mxx -= lfps[i0-1].Mxx;
            Mxy -= lfps[i0-1].Mxy;
            Myy -= lfps[i0-1].Myy;
            W   -= lfps[i0-1].W;
        }

    } else {
        // i0 > i1, e.g. [15, 2]. Wrap around.
        assert(i0 > 0);

        Mx  = lfps[sz-1].Mx   - lfps[i0-1].Mx;
        My  = lfps[sz-1].My   - lfps[i0-1].My;
        Mxx = lfps[sz-1].Mxx  - lfps[i0-1].Mxx;
        Mxy = lfps[sz-1].Mxy  - lfps[i0-1].Mxy;
        Myy = lfps[sz-1].Myy  - lfps[i0-1].Myy;
        W   = lfps[sz-1].W    - lfps[i0-1].W;

        Mx  += lfps[i1].Mx;
        My  += lfps[i1].My;
        Mxx += lfps[i1].Mxx;
        Mxy += lfps[i1].Mxy;
        Myy += lfps[i1].Myy;
        W   += lfps[i1].W;

        N = sz - i0 + i1 + 1;
    }

    assert(N >= 2);

    double Ex = Mx / W;
    double Ey = My / W;
    double Cxx = Mxx / W - Ex*Ex;
    double Cxy = Mxy / W - Ex*Ey;
    double Cyy = Myy / W - Ey*Ey;

    //if (1) {
    //    // on iOS about 5% of total CPU spent in these trig functions.
    //    // 85 ms per frame on 5S, example.pnm
    //    //
    //    // XXX this was using the double-precision atan2. Was there a case where
    //    // we needed that precision? Seems doubtful.
    //    double normal_theta = .5 * atan2f(-2*Cxy, (Cyy - Cxx));
    //    nx_old = cosf(normal_theta);
    //    ny_old = sinf(normal_theta);
    //}
    
    // Instead of using the above cos/sin method, pose it as an eigenvalue problem.
    double eig_small = 0.5*(Cxx + Cyy - sqrtf((Cxx - Cyy)*(Cxx - Cyy) + 4*Cxy*Cxy));

    if (lineparm) {
        lineparm[0] = Ex;
        lineparm[1] = Ey;

        double eig = 0.5*(Cxx + Cyy + sqrtf((Cxx - Cyy)*(Cxx - Cyy) + 4*Cxy*Cxy));
        double nx1 = Cxx - eig;
        double ny1 = Cxy;
        double M1 = nx1*nx1 + ny1*ny1;
        double nx2 = Cxy;
        double ny2 = Cyy - eig;
        double M2 = nx2*nx2 + ny2*ny2;

        double nx, ny, M;
        if (M1 > M2) {
            nx = nx1;
            ny = ny1;
            M = M1;
        } else {
            nx = nx2;
            ny = ny2;
            M = M2;
        }

        double length = sqrtf(M);
        lineparm[2] = nx/length;
        lineparm[3] = ny/length;
    }

    // sum of squared errors =
    //
    // SUM_i ((p_x - ux)*nx + (p_y - uy)*ny)^2
    // SUM_i  nx*nx*(p_x - ux)^2 + 2nx*ny(p_x -ux)(p_y-uy) + ny*ny*(p_y-uy)*(p_y-uy)
    //  nx*nx*SUM_i((p_x -ux)^2) + 2nx*ny*SUM_i((p_x-ux)(p_y-uy)) + ny*ny*SUM_i((p_y-uy)^2)
    //
    //  nx*nx*N*Cxx + 2nx*ny*N*Cxy + ny*ny*N*Cyy

    // sum of squared errors
    if (err)
        *err = N*eig_small;

    // mean squared error
    if (mse)
        *mse = eig_small;
}